

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TrackedSection * __thiscall
Catch::SectionTracking::TrackedSection::findChild(TrackedSection *this,string *childName)

{
  iterator iVar1;
  TrackedSection *pTVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
          ::find(&(this->m_children)._M_t,childName);
  pTVar2 = (TrackedSection *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_children)._M_t._M_impl.super__Rb_tree_header) {
    pTVar2 = (TrackedSection *)(iVar1._M_node + 2);
  }
  return pTVar2;
}

Assistant:

TrackedSection* findChild( std::string const& childName ) {
            TrackedSections::iterator it = m_children.find( childName );
            return it != m_children.end()
                ? &it->second
                : NULL;
        }